

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArduinoPressureSensor.h
# Opt level: O0

int GetLatestDataArduinoPressureSensor
              (ARDUINOPRESSURESENSOR *pArduinoPressureSensor,
              ARDUINOPRESSURESENSORDATA *pArduinoPressureSensorData)

{
  int iVar1;
  double dVar2;
  undefined1 local_390 [8];
  CHRONO chrono;
  char *ptr_T;
  char *ptr_P;
  int local_330;
  int recvbuflen;
  int Bytes;
  int BytesReceived;
  char savebuf [256];
  char recvbuf [512];
  ARDUINOPRESSURESENSORDATA *pArduinoPressureSensorData_local;
  ARDUINOPRESSURESENSOR *pArduinoPressureSensor_local;
  
  recvbuflen = 0;
  local_330 = 0;
  chrono.Suspended = 0;
  chrono._68_4_ = 0;
  StartChrono((CHRONO *)local_390);
  memset(savebuf + 0xf8,0,0x200);
  memset(&Bytes,0,0x100);
  recvbuflen = 0;
  iVar1 = ReadRS232Port(&pArduinoPressureSensor->RS232Port,(uint8 *)(savebuf + 0xf8),0xff,&local_330
                       );
  if (iVar1 == 0) {
    if ((pArduinoPressureSensor->bSaveRawData != 0) &&
       (pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
      fwrite(savebuf + 0xf8,(long)local_330,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
      fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
    }
    recvbuflen = local_330 + recvbuflen;
    if (0xfe < recvbuflen) {
      while (local_330 == 0xff) {
        dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_390);
        if (4.0 < dVar2) {
          printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
          return 2;
        }
        memcpy(&Bytes,savebuf + 0xf8,(long)local_330);
        iVar1 = ReadRS232Port(&pArduinoPressureSensor->RS232Port,(uint8 *)(savebuf + 0xf8),0xff,
                              &local_330);
        if (iVar1 != 0) {
          printf("Error reading data from an ArduinoPressureSensor. \n");
          return 1;
        }
        if ((pArduinoPressureSensor->bSaveRawData != 0) &&
           (pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
          fwrite(savebuf + 0xf8,(long)local_330,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
          fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
        }
        recvbuflen = local_330 + recvbuflen;
      }
      memmove(recvbuf + (0xf7 - (long)local_330),savebuf + 0xf8,(long)local_330);
      memcpy(savebuf + 0xf8,(void *)((long)&Bytes + (long)local_330),(long)(0xff - local_330));
      recvbuflen = 0xff;
    }
    ptr_T = FindLatestArduinoPressureSensorSentence("Pressure: ",savebuf + 0xf8);
    chrono._64_8_ = FindLatestArduinoPressureSensorSentence("Temperature: ",savebuf + 0xf8);
    while (ptr_T == (char *)0x0 || chrono._64_8_ == 0) {
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_390);
      if (4.0 < dVar2) {
        printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
        return 2;
      }
      if (0x1fe < recvbuflen) {
        printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadRS232Port(&pArduinoPressureSensor->RS232Port,
                            (uint8 *)(savebuf + (long)recvbuflen + 0xf8),0x1ff - recvbuflen,
                            &local_330);
      if (iVar1 != 0) {
        printf("Error reading data from an ArduinoPressureSensor. \n");
        return 1;
      }
      if ((pArduinoPressureSensor->bSaveRawData != 0) &&
         (pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
        fwrite(savebuf + (long)recvbuflen + 0xf8,(long)local_330,1,
               (FILE *)pArduinoPressureSensor->pfSaveFile);
        fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
      }
      recvbuflen = local_330 + recvbuflen;
      ptr_T = FindLatestArduinoPressureSensorSentence("Pressure: ",savebuf + 0xf8);
      chrono._64_8_ = FindLatestArduinoPressureSensorSentence("Temperature: ",savebuf + 0xf8);
    }
    if (ptr_T != (char *)0x0) {
      iVar1 = __isoc99_sscanf(ptr_T,"Pressure: %lf mbar",pArduinoPressureSensorData);
      if (iVar1 != 1) {
        printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
        return 1;
      }
      pArduinoPressureSensorData->Pressure = pArduinoPressureSensorData->pressure / 1000.0;
    }
    if ((chrono._64_8_ == 0) ||
       (iVar1 = __isoc99_sscanf(ptr_T,"Temperature: %lf deg C",
                                &pArduinoPressureSensorData->temperature), iVar1 == 1)) {
      memcpy(&pArduinoPressureSensor->LastArduinoPressureSensorData,pArduinoPressureSensorData,0x28)
      ;
      pArduinoPressureSensor_local._4_4_ = 0;
    }
    else {
      printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
      pArduinoPressureSensor_local._4_4_ = 1;
    }
  }
  else {
    printf("Error reading data from an ArduinoPressureSensor. \n");
    pArduinoPressureSensor_local._4_4_ = 1;
  }
  return pArduinoPressureSensor_local._4_4_;
}

Assistant:

inline int GetLatestDataArduinoPressureSensor(ARDUINOPRESSURESENSOR* pArduinoPressureSensor, ARDUINOPRESSURESENSORDATA* pArduinoPressureSensorData)
{
	char recvbuf[2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR];
	char savebuf[MAX_NB_BYTES_ARDUINOPRESSURESENSOR];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_P = NULL;
	char* ptr_T = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from an ArduinoPressureSensor. \n");
		return EXIT_FAILURE;
	}
	if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
		fflush(pArduinoPressureSensor->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_ARDUINOPRESSURESENSOR)
			{
				printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from an ArduinoPressureSensor. \n");
				return EXIT_FAILURE;
			}
			if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
				fflush(pArduinoPressureSensor->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr_P = FindLatestArduinoPressureSensorSentence("Pressure: ", recvbuf);
	ptr_T = FindLatestArduinoPressureSensorSentence("Temperature: ", recvbuf);

	while ((!ptr_P)||(!ptr_T))
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_ARDUINOPRESSURESENSOR)
		{
			printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from an ArduinoPressureSensor. \n");
			return EXIT_FAILURE;
		}
		if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
			fflush(pArduinoPressureSensor->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr_P = FindLatestArduinoPressureSensorSentence("Pressure: ", recvbuf);
		ptr_T = FindLatestArduinoPressureSensorSentence("Temperature: ", recvbuf);
	}

	// Analyze data.

	//memset(pArduinoPressureSensorData, 0, sizeof(ARDUINOPRESSURESENSORDATA));

	if (ptr_P)
	{
		if (sscanf(ptr_P, "Pressure: %lf mbar", &pArduinoPressureSensorData->pressure) != 1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_FAILURE;
		}
		// Conversions...
		pArduinoPressureSensorData->Pressure = pArduinoPressureSensorData->pressure/1000.0;
	}
	if (ptr_T)
	{
		if (sscanf(ptr_P, "Temperature: %lf deg C", &pArduinoPressureSensorData->temperature) != 1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}

	pArduinoPressureSensor->LastArduinoPressureSensorData = *pArduinoPressureSensorData;

	return EXIT_SUCCESS;
}